

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

quad<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
           *this,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  default_traits<unsigned_char,_charls::quad<unsigned_char>_> *this_00;
  array<charls::context_run_mode,_2UL> *context;
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  
  context = &this->context_run_mode_;
  iVar6 = decode_run_interruption_error(this,context->_M_elems);
  iVar7 = decode_run_interruption_error(this,context->_M_elems);
  iVar8 = decode_run_interruption_error(this,context->_M_elems);
  iVar9 = decode_run_interruption_error(this,context->_M_elems);
  this_00 = &this->traits_;
  iVar1 = -iVar6;
  if (((uint)ra & 0xff) <= ((uint)rb & 0xff)) {
    iVar1 = iVar6;
  }
  bVar2 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + ((uint)rb & 0xff));
  uVar10 = (uint)rb >> 8 & 0xff;
  iVar1 = -iVar7;
  if (((uint)ra >> 8 & 0xff) <= uVar10) {
    iVar1 = iVar7;
  }
  bVar3 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + uVar10);
  uVar10 = (uint)rb >> 0x10 & 0xff;
  iVar1 = -iVar8;
  if (((uint)ra >> 0x10 & 0xff) <= uVar10) {
    iVar1 = iVar8;
  }
  bVar4 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + uVar10);
  iVar1 = -iVar9;
  if ((uint)ra >> 0x18 <= (uint)rb >> 0x18) {
    iVar1 = iVar9;
  }
  bVar5 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + ((uint)rb >> 0x18));
  return (quad<unsigned_char>)
         ((uint)bVar5 << 0x18 | (uint)bVar2 | (uint)bVar3 << 8 | (uint)bVar4 << 0x10);
}

Assistant:

quad<sample_type> decode_run_interruption_pixel(quad<sample_type> ra, quad<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value4{decode_run_interruption_error(context_run_mode_[0])};

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }